

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>
::redux<Eigen::internal::scalar_max_op<double,double,0>>
          (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
           *this,scalar_max_op<double,_double,_0> *func)

{
  undefined8 *puVar1;
  Scalar SVar2;
  ThisEvaluator thisEval;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  rStack_18;
  
  puVar1 = *(undefined8 **)this;
  rStack_18.
  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  .
  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
  .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  m_outerStride = puVar1[1];
  if ((0 < rStack_18.
           super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           .
           super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
           .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
           m_outerStride) && (0 < (long)puVar1[2])) {
    rStack_18.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
         (double *)*puVar1;
    SVar2 = internal::
            redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>,3,0>
            ::
            run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                      (&rStack_18,func,
                       (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)this);
    return SVar2;
  }
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                ,0x19b,
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, -1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, -1>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}